

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureQueryCase::createInstance(TextureQueryCase *this,Context *context)

{
  Context *context_local;
  TextureQueryCase *this_local;
  
  switch(this->m_function) {
  case QUERYFUNCTION_TEXTURESIZE:
    this_local = (TextureQueryCase *)operator_new(0x248);
    TextureSizeInstance::TextureSizeInstance
              ((TextureSizeInstance *)this_local,context,
               (bool)((this->super_ShaderRenderCase).m_isVertexCase & 1),&this->m_textureSpec);
    break;
  case QUERYFUNCTION_TEXTUREQUERYLOD:
    this_local = (TextureQueryCase *)operator_new(0x248);
    TextureQueryLodInstance::TextureQueryLodInstance
              ((TextureQueryLodInstance *)this_local,context,
               (bool)((this->super_ShaderRenderCase).m_isVertexCase & 1),&this->m_textureSpec);
    break;
  case QUERYFUNCTION_TEXTUREQUERYLEVELS:
    this_local = (TextureQueryCase *)operator_new(0x230);
    TextureQueryLevelsInstance::TextureQueryLevelsInstance
              ((TextureQueryLevelsInstance *)this_local,context,
               (bool)((this->super_ShaderRenderCase).m_isVertexCase & 1),&this->m_textureSpec);
    break;
  case QUERYFUNCTION_TEXTURESAMPLES:
    this_local = (TextureQueryCase *)operator_new(0x238);
    TextureSamplesInstance::TextureSamplesInstance
              ((TextureSamplesInstance *)this_local,context,
               (bool)((this->super_ShaderRenderCase).m_isVertexCase & 1),&this->m_textureSpec);
    break;
  default:
    this_local = (TextureQueryCase *)0x0;
  }
  return (TestInstance *)this_local;
}

Assistant:

TestInstance* TextureQueryCase::createInstance (Context& context) const
{
	switch (m_function)
	{
		case QUERYFUNCTION_TEXTURESIZE:				return new TextureSizeInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTUREQUERYLOD:			return new TextureQueryLodInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTUREQUERYLEVELS:		return new TextureQueryLevelsInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTURESAMPLES:			return new TextureSamplesInstance(context, m_isVertexCase, m_textureSpec);
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}